

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueLittleInt16::read
          (PLYValueLittleInt16 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  ushort uVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  byte *pbVar6;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  pbVar3 = (byte *)plVar5[2];
  pbVar6 = (byte *)plVar5[3];
  if (pbVar3 < pbVar6) {
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + 1;
    plVar5[2] = (long)pbVar3;
  }
  else {
    bVar1 = (**(code **)(*plVar5 + 0x50))(plVar5);
    pbVar3 = (byte *)plVar5[2];
    pbVar6 = (byte *)plVar5[3];
  }
  uVar4 = (ushort)bVar1;
  this->value = (ushort)bVar1;
  if (pbVar3 < pbVar6) {
    uVar2 = (uint)*pbVar3;
    plVar5[2] = (long)(pbVar3 + 1);
  }
  else {
    uVar2 = (**(code **)(*plVar5 + 0x50))(plVar5);
    uVar4 = this->value;
  }
  this->value = uVar4 | (ushort)(uVar2 << 8);
  return (ulong)(uVar2 << 8);
}

Assistant:

void read(std::streambuf *in)
    {
      value=static_cast<short>(in->sbumpc()&0xff);
      value|=static_cast<short>(in->sbumpc()<<8);
    }